

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::UnaryBinsSelectExprSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,UnaryBinsSelectExprSyntax *this,size_t index)

{
  Token token;
  BinsSelectConditionExprSyntax *node;
  size_t index_local;
  UnaryBinsSelectExprSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->op).kind;
    token._2_1_ = (this->op).field_0x2;
    token.numFlags.raw = (this->op).numFlags.raw;
    token.rawLen = (this->op).rawLen;
    token.info = (this->op).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = not_null<slang::syntax::BinsSelectConditionExprSyntax_*>::get(&this->expr);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax UnaryBinsSelectExprSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return op;
        case 1: return expr.get();
        default: return nullptr;
    }
}